

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  unsigned_long numFrames;
  snd_pcm_uframes_t sVar5;
  pthread_t __thread1;
  char *pcVar6;
  void *__dest;
  snd_pcm_uframes_t framesGot;
  PaError local_48;
  int xrun;
  snd_pcm_uframes_t framesAvail;
  void *local_38;
  
  uVar1 = *(undefined8 *)((long)s + 0x2c0);
  if (*(long *)((long)s + 0x340) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4572\n"
                     );
    local_48 = -0x26f6;
  }
  else {
    *(undefined8 *)((long)s + 0x2c0) = 0;
    local_48 = 0;
    if (0.0 < *(double *)((long)s + 0x278)) {
      *(undefined8 *)((long)s + 0x278) = 0;
      local_48 = -0x26fc;
    }
    __dest = buffer;
    if (*(int *)((long)s + 0x318) == 0) {
      __dest = *(void **)((long)s + 0x368);
      memcpy(__dest,buffer,(long)*(int *)((long)s + 0x310) << 3);
    }
    local_38 = __dest;
    do {
      if (frames == 0) goto LAB_0010e735;
      xrun = 0;
      paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&framesAvail,&xrun);
      if (paUtilErr_ < 0) {
        pcVar6 = 
        "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4596\n"
        ;
LAB_0010e76d:
        PaUtil_DebugPrint(pcVar6);
        local_48 = paUtilErr_;
        goto LAB_0010e735;
      }
      framesGot = framesAvail;
      if (frames <= framesAvail) {
        framesGot = frames;
      }
      paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&framesGot,&xrun);
      if (paUtilErr_ < 0) {
        pcVar6 = 
        "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4599\n"
        ;
        goto LAB_0010e76d;
      }
      if (framesGot != 0) {
        numFrames = PaUtil_CopyOutput((PaUtilBufferProcessor *)((long)s + 0x68),&local_38,framesGot)
        ;
        framesGot = numFrames;
        paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&xrun);
        if (paUtilErr_ < 0) {
          pcVar6 = 
          "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4603\n"
          ;
          goto LAB_0010e76d;
        }
        frames = frames - numFrames;
      }
      sVar5 = GetStreamWriteAvailable(s);
      paUtilErr_ = (PaError)sVar5;
      if (paUtilErr_ < 0) {
        pcVar6 = 
        "Expression \'err = GetStreamWriteAvailable( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4610\n"
        ;
        goto LAB_0010e76d;
      }
      lVar2 = *(long *)((long)s + 0x350);
      framesAvail = sVar5;
      iVar3 = snd_pcm_state(*(undefined8 *)((long)s + 0x340));
    } while (((iVar3 != 2) || (lVar2 - sVar5 < *(ulong *)((long)s + 0x348))) ||
            (iVar3 = snd_pcm_start(*(undefined8 *)((long)s + 0x340)), -1 < iVar3));
    __thread1 = pthread_self();
    iVar4 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar4 != 0) {
      pcVar6 = (char *)snd_strerror(iVar3);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar3,pcVar6);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4617\n"
                     );
    local_48 = -9999;
  }
LAB_0010e735:
  *(undefined8 *)((long)s + 0x2c0) = uVar1;
  return local_48;
}

Assistant:

static PaError WriteStream( PaStream* s, const void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    signed long err;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    snd_pcm_uframes_t framesGot, framesAvail;
    const void *userBuffer;
    snd_pcm_t *save = stream->capture.pcm;

    assert( stream );

    PA_UNLESS( stream->playback.pcm, paCanNotWriteToAnInputOnlyStream );

    /* Disregard capture */
    stream->capture.pcm = NULL;

    if( stream->underrun > 0. )
    {
        result = paOutputUnderflowed;
        stream->underrun = 0.0;
    }

    if( stream->playback.userInterleaved )
        userBuffer = buffer;
    else /* Copy channels into local array */
    {
        userBuffer = stream->playback.userBuffers;
        memcpy( (void *)userBuffer, buffer, sizeof (void *) * stream->playback.numUserChannels );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        snd_pcm_uframes_t hwAvail;

        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyOutput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }

        /* Start stream after one period of samples worth */

        /* Frames residing in buffer */
        PA_ENSURE( err = GetStreamWriteAvailable( stream ) );
        framesAvail = err;
        hwAvail = stream->playback.alsaBufferSize - framesAvail;

        if( alsa_snd_pcm_state( stream->playback.pcm ) == SND_PCM_STATE_PREPARED &&
                hwAvail >= stream->playback.framesPerPeriod )
        {
            ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
    }

end:
    stream->capture.pcm = save;
    return result;
error:
    goto end;
}